

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::ConfidentialTransactionContext::UpdateFeeAmount
          (ConfidentialTransactionContext *this,Amount *value,ConfidentialAssetId *asset)

{
  bool bVar1;
  uint32_t uVar2;
  ConfidentialAssetId *in_RDX;
  Amount *in_RSI;
  ConfidentialTransaction *in_RDI;
  uint32_t index;
  Amount result;
  ByteData local_c0;
  ByteData local_a8;
  ConfidentialNonce local_80;
  uint32_t *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  uint32_t index_00;
  Amount local_28;
  ConfidentialAssetId *local_18;
  Amount *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  core::Amount::Amount(&local_28);
  index_00 = 0;
  bVar1 = IsFindFeeTxOut((ConfidentialTransactionContext *)(ulong)in_stack_ffffffffffffffd0,
                         in_stack_ffffffffffffffc8);
  if (bVar1) {
    uVar2 = index_00;
    core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&stack0xffffffffffffffa8,local_10);
    core::ConfidentialNonce::ConfidentialNonce(&local_80);
    core::ByteData::ByteData(&local_a8);
    core::ByteData::ByteData(&local_c0);
    core::ConfidentialTransaction::SetTxOutCommitment
              (in_RDI,index_00,local_18,(ConfidentialValue *)&stack0xffffffffffffffa8,&local_80,
               &local_a8,&local_c0);
    core::ByteData::~ByteData((ByteData *)0x57c65c);
    core::ByteData::~ByteData((ByteData *)0x57c666);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x57c670);
    core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x57c67d);
  }
  else {
    uVar2 = core::ConfidentialTransaction::AddTxOutFee(in_RDI,local_10,local_18);
  }
  return uVar2;
}

Assistant:

uint32_t ConfidentialTransactionContext::UpdateFeeAmount(
    const Amount& value, const ConfidentialAssetId& asset) {
  Amount result;
  uint32_t index = 0;
  if (IsFindFeeTxOut(&index)) {
    SetTxOutCommitment(
        index, asset, ConfidentialValue(value), ConfidentialNonce(),
        ByteData(), ByteData());
  } else {
    index = AddTxOutFee(value, asset);
  }
  return index;
}